

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O3

void __thiscall lsim::SimCircuit::build_name(SimCircuit *this,uint32_t comp_id)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  string __str;
  long local_50;
  long lStack_48;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  std::__cxx11::string::_M_assign((string *)&this->m_name);
  cVar4 = '\x01';
  if (9 < comp_id) {
    uVar2 = comp_id;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00118928;
      }
      if (uVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00118928;
      }
      if (uVar2 < 10000) goto LAB_00118928;
      bVar1 = 99999 < uVar2;
      uVar2 = uVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00118928:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,comp_id);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x12f35a);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_50 = *plVar6;
    lStack_48 = plVar5[3];
    plVar7 = &local_50;
  }
  else {
    local_50 = *plVar6;
    plVar7 = (long *)*plVar5;
  }
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&this->m_name,(ulong)plVar7);
  if (plVar7 != &local_50) {
    operator_delete(plVar7,local_50 + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void SimCircuit::build_name(uint32_t comp_id) {
    m_name = m_circuit_desc->name();
    m_name += "#" + std::to_string(comp_id);
}